

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR eval_predicate(lyxp_expr *exp,uint32_t *tok_idx,lyxp_set *set,uint32_t options,lyxp_axis axis
                     )

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  lyxp_set_node *plVar5;
  longdouble lVar6;
  LY_ERR ret__;
  LY_ERR LVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  undefined4 uVar13;
  int iVar14;
  char *pcVar15;
  int local_f8;
  lyxp_set set2;
  
  memset(&set2,0,0x90);
  pcVar15 = "skipped";
  if ((options & 0x20) == 0) {
    pcVar15 = "parsed";
  }
  pcVar8 = lyxp_token2str(exp->tokens[*tok_idx]);
  ly_log_dbg(2,"%-27s %s %s[%u]","eval_predicate",pcVar15,pcVar8,(ulong)exp->tok_pos[*tok_idx]);
  uVar1 = *tok_idx;
  *tok_idx = uVar1 + 1;
  if ((options & 0x20) == 0) {
    if (set->type == LYXP_SET_NODE_SET) {
      iVar14 = set_sort(set);
      if (iVar14 != 0) {
        __assert_fail("!set_sort(set)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x1d61,
                      "LY_ERR eval_predicate(const struct lyxp_expr *, uint32_t *, struct lyxp_set *, uint32_t, enum lyxp_axis)"
                     );
      }
      uVar2 = set->used;
      if (uVar2 != 0) {
        uVar11 = 0;
        local_f8 = 1;
        if ((axis < LYXP_AXIS_SELF) &&
           (uVar11 = 0, local_f8 = 1, (0x603U >> (axis & 0x1f) & 1) != 0)) {
          uVar11 = uVar2 + 1;
          local_f8 = -1;
        }
        uVar1 = *tok_idx;
        lVar10 = 0xc;
        uVar3 = uVar2;
        for (uVar12 = 0; uVar11 = uVar11 + local_f8, uVar12 < uVar3; uVar12 = uVar12 + 1) {
          set_init(&set2,set);
          plVar5 = (set->val).nodes;
          set_insert_node(&set2,*(lyd_node **)((long)plVar5 + lVar10 + -0xc),
                          *(uint32_t *)((long)&plVar5->node + lVar10),
                          *(lyxp_node_type *)((long)plVar5 + lVar10 + -4),0);
          *tok_idx = uVar1;
          set2.ctx_pos = uVar11;
          set2.ctx_size = uVar2;
          LVar7 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,&set2,options);
          if ((LVar7 == LY_SUCCESS) && (set2.not_found != '\0')) {
            set->not_found = '\x01';
            break;
          }
          if (LVar7 != LY_SUCCESS) goto LAB_001a317a;
          if (set2.type == LYXP_SET_NUMBER) {
            lVar6 = ROUND(set2.val.num);
            set2.val.num = (longdouble)0;
            if ((long)lVar6 == (ulong)uVar11) {
              set2.val.num = (longdouble)1;
            }
          }
          lyxp_set_cast(&set2,LYXP_SET_BOOLEAN);
          if (set2.val.bln == '\0') {
            set_remove_node_none(set,(uint32_t)uVar12);
          }
          uVar3 = set->used;
          lVar10 = lVar10 + 0x10;
        }
        set_remove_nodes_none(set);
        goto LAB_001a32bc;
      }
    }
    else {
      if (set->type != LYXP_SET_SCNODE_SET) {
        set2.type = LYXP_SET_NODE_SET;
        set_fill_set(&set2,set);
        LVar7 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,&set2,options);
        if (LVar7 != LY_SUCCESS) {
LAB_001a317a:
          lyxp_set_free_content(&set2);
          return LVar7;
        }
        lyxp_set_cast(&set2,LYXP_SET_BOOLEAN);
        if (set2.val.bln == '\0') {
          lyxp_set_free_content(set);
        }
        lyxp_set_free_content(&set2);
        goto LAB_001a32bc;
      }
      lVar10 = 0xc;
      uVar12 = (ulong)set->used;
      for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
        if (*(int *)((long)&((set->val).nodes)->node + lVar10) == 2) {
          if (set->used != (uint)uVar9) {
            iVar14 = 4;
            do {
              lVar10 = 0;
              do {
                if (uVar12 * 0x18 + 0x18 == lVar10 + 0x18) {
                  for (lVar10 = 0; uVar12 * 0x18 - lVar10 != 0; lVar10 = lVar10 + 0x18) {
                    if (*(int *)((long)&((set->val).nodes)->pos + lVar10) == 2) {
                      *(int *)((long)&((set->val).nodes)->pos + lVar10) = iVar14;
                    }
                  }
                  lVar10 = 0xc;
                  for (uVar9 = 0; uVar9 < uVar12; uVar9 = uVar9 + 1) {
                    if (*(int *)((long)&((set->val).nodes)->node + lVar10) == iVar14) {
                      *(undefined4 *)((long)&((set->val).nodes)->node + lVar10) = 2;
                      *tok_idx = uVar1 + 1;
                      LVar7 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,set,options);
                      if (LVar7 != LY_SUCCESS) {
                        return LVar7;
                      }
                      if (set->not_found != '\0') {
                        uVar12 = (ulong)set->used;
                        break;
                      }
                      *(int *)((long)&((set->val).nodes)->node + lVar10) = iVar14;
                      uVar12 = (ulong)set->used;
                    }
                    lVar10 = lVar10 + 0x18;
                  }
                  for (lVar10 = 0; uVar12 * 0x18 - lVar10 != 0; lVar10 = lVar10 + 0x18) {
                    iVar4 = *(int *)((long)&((set->val).nodes)->pos + lVar10);
                    uVar13 = 0;
                    if ((iVar4 == 2) || (uVar13 = 2, iVar4 == iVar14)) {
                      *(undefined4 *)((long)&((set->val).nodes)->pos + lVar10) = uVar13;
                    }
                  }
                  goto LAB_001a32bc;
                }
                iVar4 = *(int *)((long)&((set->val).nodes)->pos + lVar10);
                lVar10 = lVar10 + 0x18;
              } while (iVar4 < iVar14);
              iVar14 = iVar4 + 1;
            } while( true );
          }
          break;
        }
        lVar10 = lVar10 + 0x18;
      }
    }
  }
  LVar7 = eval_expr_select(exp,tok_idx,LYXP_EXPR_NONE,set,options | 0x20);
  if (LVar7 != LY_SUCCESS) {
    return LVar7;
  }
LAB_001a32bc:
  if (exp->tokens[*tok_idx] == LYXP_TOKEN_BRACK2) {
    ly_log_dbg(2,"%-27s %s %s[%u]","eval_predicate",pcVar15,"]",(ulong)exp->tok_pos[*tok_idx]);
    *tok_idx = *tok_idx + 1;
    return LY_SUCCESS;
  }
  __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_BRACK2",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                0x1de3,
                "LY_ERR eval_predicate(const struct lyxp_expr *, uint32_t *, struct lyxp_set *, uint32_t, enum lyxp_axis)"
               );
}

Assistant:

static LY_ERR
eval_predicate(const struct lyxp_expr *exp, uint32_t *tok_idx, struct lyxp_set *set, uint32_t options, enum lyxp_axis axis)
{
    LY_ERR rc;
    uint32_t i, orig_exp, orig_pos, orig_size;
    int32_t pred_in_ctx;
    ly_bool reverse_axis = 0;
    struct lyxp_set set2 = {0};

    /* '[' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
            lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
    ++(*tok_idx);

    if (options & LYXP_SKIP_EXPR) {
only_parse:
        rc = eval_expr_select(exp, tok_idx, 0, set, options | LYXP_SKIP_EXPR);
        LY_CHECK_RET(rc);
    } else if (set->type == LYXP_SET_NODE_SET) {
        /* we (possibly) need the set sorted, it can affect the result (if the predicate result is a number) */
        assert(!set_sort(set));

        /* empty set, nothing to evaluate */
        if (!set->used) {
            goto only_parse;
        }

        /* decide forward or reverse axis */
        switch (axis) {
        case LYXP_AXIS_ANCESTOR:
        case LYXP_AXIS_ANCESTOR_OR_SELF:
        case LYXP_AXIS_PRECEDING:
        case LYXP_AXIS_PRECEDING_SIBLING:
            reverse_axis = 1;
            break;
        case LYXP_AXIS_DESCENDANT:
        case LYXP_AXIS_DESCENDANT_OR_SELF:
        case LYXP_AXIS_FOLLOWING:
        case LYXP_AXIS_FOLLOWING_SIBLING:
        case LYXP_AXIS_PARENT:
        case LYXP_AXIS_CHILD:
        case LYXP_AXIS_SELF:
        case LYXP_AXIS_ATTRIBUTE:
            reverse_axis = 0;
            break;
        }

        orig_exp = *tok_idx;
        orig_pos = reverse_axis ? set->used + 1 : 0;
        orig_size = set->used;
        for (i = 0; i < set->used; ++i) {
            set_init(&set2, set);
            set_insert_node(&set2, set->val.nodes[i].node, set->val.nodes[i].pos, set->val.nodes[i].type, 0);

            /* remember the node context position for position() and context size for last() */
            orig_pos += reverse_axis ? -1 : 1;

            set2.ctx_pos = orig_pos;
            set2.ctx_size = orig_size;
            *tok_idx = orig_exp;

            rc = eval_expr_select(exp, tok_idx, 0, &set2, options);
            if (!rc && set2.not_found) {
                set->not_found = 1;
                break;
            }
            if (rc) {
                lyxp_set_free_content(&set2);
                return rc;
            }

            /* number is a proximity position */
            if (set2.type == LYXP_SET_NUMBER) {
                if ((long long)set2.val.num == orig_pos) {
                    set2.val.num = 1;
                } else {
                    set2.val.num = 0;
                }
            }
            lyxp_set_cast(&set2, LYXP_SET_BOOLEAN);

            /* predicate satisfied or not? */
            if (!set2.val.bln) {
                set_remove_node_none(set, i);
            }
        }
        set_remove_nodes_none(set);

    } else if (set->type == LYXP_SET_SCNODE_SET) {
        for (i = 0; i < set->used; ++i) {
            if (set->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_CTX) {
                /* there is a currently-valid node */
                break;
            }
        }
        /* empty set, nothing to evaluate */
        if (i == set->used) {
            goto only_parse;
        }

        orig_exp = *tok_idx;

        /* set special in_ctx to all the valid snodes */
        pred_in_ctx = set_scnode_new_in_ctx(set);

        /* use the valid snodes one-by-one */
        for (i = 0; i < set->used; ++i) {
            if (set->val.scnodes[i].in_ctx != pred_in_ctx) {
                continue;
            }
            set->val.scnodes[i].in_ctx = LYXP_SET_SCNODE_ATOM_CTX;

            *tok_idx = orig_exp;

            rc = eval_expr_select(exp, tok_idx, 0, set, options);
            if (!rc && set->not_found) {
                break;
            }
            LY_CHECK_RET(rc);

            set->val.scnodes[i].in_ctx = pred_in_ctx;
        }

        /* restore the state as it was before the predicate */
        for (i = 0; i < set->used; ++i) {
            if (set->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_CTX) {
                set->val.scnodes[i].in_ctx = LYXP_SET_SCNODE_ATOM_NODE;
            } else if (set->val.scnodes[i].in_ctx == pred_in_ctx) {
                set->val.scnodes[i].in_ctx = LYXP_SET_SCNODE_ATOM_CTX;
            }
        }

    } else {
        set2.type = LYXP_SET_NODE_SET;
        set_fill_set(&set2, set);

        rc = eval_expr_select(exp, tok_idx, 0, &set2, options);
        if (rc) {
            lyxp_set_free_content(&set2);
            return rc;
        }

        lyxp_set_cast(&set2, LYXP_SET_BOOLEAN);
        if (!set2.val.bln) {
            lyxp_set_free_content(set);
        }
        lyxp_set_free_content(&set2);
    }

    /* ']' */
    assert(exp->tokens[*tok_idx] == LYXP_TOKEN_BRACK2);
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
            lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
    ++(*tok_idx);

    return LY_SUCCESS;
}